

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  sVar1 = ::read(this->fdStdOutRead,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  return sVar1;
}

Assistant:

ssize Process::read(void* buffer, usize len)
{
#ifdef _WIN32
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(len > (usize)INT_MAX)
  {
    if(!ReadFile(hStdOutRead, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    len -= INT_MAX;
  }
  if(!ReadFile(hStdOutRead, buffer, (DWORD)len, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(hStdOutRead, buffer, len, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return 0;
    return -1;
  }
  return i;
#endif
#else
  return ::read(fdStdOutRead, buffer, len);
#endif
}